

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a2.cpp
# Opt level: O2

void __thiscall RasterizerA2::_renderImpl<CompositorSIMD,false>(RasterizerA2 *this,uint32_t argb32)

{
  int32_t *piVar1;
  int32_t *piVar2;
  uint8_t *puVar3;
  int iVar4;
  Image *pIVar5;
  long lVar6;
  Bounds *pBVar7;
  size_t sVar8;
  Cell *pCVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  uint32_t uVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  int iVar27;
  ulong uVar28;
  uint8_t *puVar29;
  ulong uVar30;
  bool bVar31;
  short sVar32;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  undefined1 auVar33 [16];
  short sVar40;
  undefined1 in_XMM1 [16];
  undefined1 auVar41 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar42 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar43 [16];
  int iVar45;
  int iVar49;
  int iVar50;
  int iVar51;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar53 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar54 [16];
  int iVar55;
  short sVar56;
  short sVar64;
  ushort uVar65;
  ushort uVar67;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar63 [16];
  undefined1 auVar68 [16];
  int iVar71;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  short sVar44;
  short sVar52;
  undefined1 auVar57 [12];
  undefined1 auVar62 [16];
  short sVar66;
  
  uVar30 = (ulong)(this->_yBounds).start;
  iVar4 = (this->_yBounds).end;
  pIVar5 = (this->super_CellRasterizer).super_Rasterizer._dst;
  lVar6 = pIVar5->_stride;
  puVar29 = pIVar5->_data + lVar6 * uVar30;
  uVar23 = PixelUtils::premultiply(argb32);
  auVar22 = _DAT_001181c0;
  auVar21 = _DAT_00118190;
  auVar33._4_4_ = uVar23;
  auVar33._0_4_ = uVar23;
  auVar33._8_4_ = uVar23;
  auVar33._12_4_ = uVar23;
  auVar33 = pmovzxbw(auVar33,auVar33);
  lVar24 = uVar30 * 8;
  auVar41 = pmovsxwd(in_XMM1,0x1ff01ff01ff01ff);
  auVar42 = pmovzxbw(in_XMM2,0xffffffffffffffff);
  auVar43 = pmovzxbw(in_XMM3,0x8080808080808080);
  auVar53 = pmovzxbw(in_XMM7,0xffffffffffffffff);
  auVar54 = pmovzxbw(in_XMM8,0x8080808080808080);
  for (; uVar30 <= (ulong)(long)iVar4; uVar30 = uVar30 + 1) {
    pBVar7 = this->_xBounds;
    if (pBVar7[uVar30].end != 0) {
      sVar8 = this->_cellStride;
      pCVar9 = this->_cells;
      uVar25 = (ulong)pBVar7[uVar30].start;
      iVar27 = pBVar7[uVar30].end + 1;
      iVar71 = (this->super_CellRasterizer).super_Rasterizer._width;
      if (iVar71 < iVar27) {
        iVar27 = iVar71;
      }
      pBVar7[uVar30].start = 0x7fffffff;
      pBVar7[uVar30].end = 0;
      uVar28 = (long)iVar27 - uVar25;
      iVar71 = 0;
      sVar32 = auVar33._0_2_;
      sVar34 = auVar33._2_2_;
      sVar35 = auVar33._4_2_;
      sVar36 = auVar33._6_2_;
      sVar37 = auVar33._8_2_;
      sVar38 = auVar33._10_2_;
      sVar39 = auVar33._12_2_;
      sVar40 = auVar33._14_2_;
      if (3 < uVar28) {
        uVar28 = uVar28 >> 2;
        lVar26 = sVar8 * lVar24;
        while (bVar31 = uVar28 != 0, uVar28 = uVar28 - 1, bVar31) {
          piVar1 = (int32_t *)((long)&pCVar9[uVar25].cover + lVar26);
          iVar55 = *piVar1;
          piVar2 = (int32_t *)((long)&pCVar9[uVar25 + 2].cover + lVar26);
          iVar49 = iVar55 + piVar1[2];
          auVar59._4_4_ = iVar49;
          auVar59._0_4_ = iVar55;
          auVar59._8_8_ = 0;
          iVar45 = iVar55 + iVar71;
          iVar50 = iVar49 + iVar71;
          iVar51 = piVar1[2] + *piVar2 + iVar71;
          iVar71 = *piVar2 + piVar2[2] + iVar71 + iVar49;
          auVar69._0_4_ = iVar45 - ((uint)piVar1[1] >> 9);
          auVar69._4_4_ = iVar50 - ((uint)piVar1[3] >> 9);
          auVar69._8_4_ = (iVar51 + iVar55) - ((uint)piVar2[1] >> 9);
          auVar69._12_4_ = iVar71 - ((uint)piVar2[3] >> 9);
          auVar47 = packusdw(auVar69 & auVar41,auVar69 & auVar41);
          iVar55 = 0x1ff01ff - auVar47._0_4_;
          iVar45 = 0x1ff01ff - auVar47._4_4_;
          iVar49 = 0x1ff01ff - auVar47._8_4_;
          iVar50 = 0x1ff01ff - auVar47._12_4_;
          sVar20 = auVar47._0_2_;
          sVar56 = (short)iVar55;
          sVar44 = auVar47._2_2_;
          sVar64 = (short)((uint)iVar55 >> 0x10);
          sVar52 = auVar47._4_2_;
          sVar66 = (short)iVar45;
          uVar65 = (ushort)(sVar52 < sVar66) * sVar52 | (ushort)(sVar52 >= sVar66) * sVar66;
          sVar52 = auVar47._6_2_;
          sVar66 = (short)((uint)iVar45 >> 0x10);
          uVar67 = (ushort)(sVar52 < sVar66) * sVar52 | (ushort)(sVar52 >= sVar66) * sVar66;
          auVar61._0_8_ =
               CONCAT26(uVar67,CONCAT24(uVar65,CONCAT22((ushort)(sVar44 < sVar64) * sVar44 |
                                                        (ushort)(sVar44 >= sVar64) * sVar64,
                                                        (ushort)(sVar20 < sVar56) * sVar20 |
                                                        (ushort)(sVar20 >= sVar56) * sVar56)));
          sVar20 = auVar47._8_2_;
          sVar44 = (short)iVar49;
          auVar57._0_10_ =
               CONCAT28((ushort)(sVar20 < sVar44) * sVar20 | (ushort)(sVar20 >= sVar44) * sVar44,
                        auVar61._0_8_);
          sVar20 = auVar47._10_2_;
          sVar44 = (short)((uint)iVar49 >> 0x10);
          auVar57._10_2_ = (ushort)(sVar20 < sVar44) * sVar20 | (ushort)(sVar20 >= sVar44) * sVar44;
          sVar20 = auVar47._12_2_;
          sVar44 = (short)iVar50;
          sVar52 = (short)((uint)iVar50 >> 0x10);
          auVar60._12_2_ = (ushort)(sVar20 < sVar44) * sVar20 | (ushort)(sVar20 >= sVar44) * sVar44;
          auVar60._0_12_ = auVar57;
          sVar20 = auVar47._14_2_;
          auVar60._14_2_ = (ushort)(sVar20 < sVar52) * sVar20 | (ushort)(sVar20 >= sVar52) * sVar52;
          auVar60 = pshuflw(auVar59 << 0x40,auVar60,0x50);
          auVar70._12_2_ = uVar67;
          auVar70._0_12_ = auVar57;
          auVar70._14_2_ = uVar67;
          auVar62._12_4_ = auVar70._12_4_;
          auVar62._10_2_ = uVar65;
          auVar62._0_10_ = auVar57._0_10_;
          auVar61._10_6_ = auVar62._10_6_;
          auVar61._8_2_ = uVar65;
          *(undefined1 (*) [16])((long)&pCVar9[uVar25].cover + lVar26) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&pCVar9[uVar25 + 2].cover + lVar26) = (undefined1  [16])0x0;
          auVar59 = *(undefined1 (*) [16])(puVar29 + uVar25 * 4);
          auVar70 = pmovzxbw(auVar47,auVar59);
          auVar68._0_4_ = auVar60._0_4_;
          auVar68._4_4_ = auVar68._0_4_;
          auVar68._8_4_ = auVar60._4_4_;
          auVar68._12_4_ = auVar60._4_4_;
          auVar47._4_4_ = auVar61._8_4_;
          auVar47._0_4_ = auVar61._8_4_;
          auVar47._8_4_ = auVar62._12_4_;
          auVar47._12_4_ = auVar62._12_4_;
          auVar68 = auVar68 ^ auVar53;
          auVar47 = auVar47 ^ auVar53;
          auVar72._0_2_ = auVar60._0_2_ * sVar32 + auVar54._0_2_ + auVar68._0_2_ * auVar70._0_2_;
          auVar72._2_2_ = auVar60._2_2_ * sVar34 + auVar54._2_2_ + auVar68._2_2_ * auVar70._2_2_;
          auVar72._4_2_ = auVar60._0_2_ * sVar35 + auVar54._4_2_ + auVar68._4_2_ * auVar70._4_2_;
          auVar72._6_2_ = auVar60._2_2_ * sVar36 + auVar54._6_2_ + auVar68._6_2_ * auVar70._6_2_;
          auVar72._8_2_ = auVar60._4_2_ * sVar37 + auVar54._8_2_ + auVar68._8_2_ * auVar70._8_2_;
          auVar72._10_2_ = auVar60._6_2_ * sVar38 + auVar54._10_2_ + auVar68._10_2_ * auVar70._10_2_
          ;
          auVar72._12_2_ = auVar60._4_2_ * sVar39 + auVar54._12_2_ + auVar68._12_2_ * auVar70._12_2_
          ;
          auVar72._14_2_ = auVar60._6_2_ * sVar40 + auVar54._14_2_ + auVar68._14_2_ * auVar70._14_2_
          ;
          auVar60 = pmulhuw(auVar72,auVar21);
          auVar63._0_2_ = uVar65 * sVar32 + auVar54._0_2_ + auVar47._0_2_ * (ushort)auVar59[8];
          auVar63._2_2_ = uVar65 * sVar34 + auVar54._2_2_ + auVar47._2_2_ * (ushort)auVar59[9];
          auVar63._4_2_ = uVar65 * sVar35 + auVar54._4_2_ + auVar47._4_2_ * (ushort)auVar59[10];
          auVar63._6_2_ = uVar65 * sVar36 + auVar54._6_2_ + auVar47._6_2_ * (ushort)auVar59[0xb];
          auVar63._8_2_ = uVar67 * sVar37 + auVar54._8_2_ + auVar47._8_2_ * (ushort)auVar59[0xc];
          auVar63._10_2_ = uVar67 * sVar38 + auVar54._10_2_ + auVar47._10_2_ * (ushort)auVar59[0xd];
          auVar63._12_2_ = uVar67 * sVar39 + auVar54._12_2_ + auVar47._12_2_ * (ushort)auVar59[0xe];
          auVar63._14_2_ = uVar67 * sVar40 + auVar54._14_2_ + auVar47._14_2_ * (ushort)auVar59[0xf];
          auVar59 = pmulhuw(auVar63,auVar21);
          sVar20 = auVar60._0_2_;
          sVar44 = auVar60._2_2_;
          sVar52 = auVar60._4_2_;
          sVar56 = auVar60._6_2_;
          sVar64 = auVar60._8_2_;
          sVar66 = auVar60._10_2_;
          sVar10 = auVar60._12_2_;
          sVar11 = auVar60._14_2_;
          sVar12 = auVar59._0_2_;
          sVar13 = auVar59._2_2_;
          sVar14 = auVar59._4_2_;
          sVar15 = auVar59._6_2_;
          sVar16 = auVar59._8_2_;
          sVar17 = auVar59._10_2_;
          sVar18 = auVar59._12_2_;
          sVar19 = auVar59._14_2_;
          puVar3 = puVar29 + uVar25 * 4;
          *puVar3 = (0 < sVar20) * (sVar20 < 0x100) * auVar60[0] - (0xff < sVar20);
          puVar3[1] = (0 < sVar44) * (sVar44 < 0x100) * auVar60[2] - (0xff < sVar44);
          puVar3[2] = (0 < sVar52) * (sVar52 < 0x100) * auVar60[4] - (0xff < sVar52);
          puVar3[3] = (0 < sVar56) * (sVar56 < 0x100) * auVar60[6] - (0xff < sVar56);
          puVar3[4] = (0 < sVar64) * (sVar64 < 0x100) * auVar60[8] - (0xff < sVar64);
          puVar3[5] = (0 < sVar66) * (sVar66 < 0x100) * auVar60[10] - (0xff < sVar66);
          puVar3[6] = (0 < sVar10) * (sVar10 < 0x100) * auVar60[0xc] - (0xff < sVar10);
          puVar3[7] = (0 < sVar11) * (sVar11 < 0x100) * auVar60[0xe] - (0xff < sVar11);
          puVar3[8] = (0 < sVar12) * (sVar12 < 0x100) * auVar59[0] - (0xff < sVar12);
          puVar3[9] = (0 < sVar13) * (sVar13 < 0x100) * auVar59[2] - (0xff < sVar13);
          puVar3[10] = (0 < sVar14) * (sVar14 < 0x100) * auVar59[4] - (0xff < sVar14);
          puVar3[0xb] = (0 < sVar15) * (sVar15 < 0x100) * auVar59[6] - (0xff < sVar15);
          puVar3[0xc] = (0 < sVar16) * (sVar16 < 0x100) * auVar59[8] - (0xff < sVar16);
          puVar3[0xd] = (0 < sVar17) * (sVar17 < 0x100) * auVar59[10] - (0xff < sVar17);
          puVar3[0xe] = (0 < sVar18) * (sVar18 < 0x100) * auVar59[0xc] - (0xff < sVar18);
          puVar3[0xf] = (0 < sVar19) * (sVar19 < 0x100) * auVar59[0xe] - (0xff < sVar19);
          uVar25 = uVar25 + 4;
        }
      }
      lVar26 = sVar8 * lVar24;
      iVar55 = iVar71;
      for (; uVar25 < (ulong)(long)iVar27; uVar25 = uVar25 + 1) {
        iVar55 = iVar55 + *(int32_t *)((long)&pCVar9[uVar25].cover + lVar26);
        *(undefined8 *)((long)&pCVar9[uVar25].cover + lVar26) = 0;
        auVar58._0_4_ = iVar55 - ((uint)*(int32_t *)((long)&pCVar9[uVar25].area + lVar26) >> 9);
        auVar58._4_4_ = iVar71;
        auVar58._8_4_ = iVar71;
        auVar58._12_4_ = iVar71;
        auVar59 = packusdw(auVar58 & auVar41,auVar58 & auVar41);
        iVar45 = auVar41._0_4_ - auVar59._0_4_;
        iVar49 = auVar41._4_4_ - auVar59._4_4_;
        iVar50 = auVar41._8_4_ - auVar59._8_4_;
        iVar51 = auVar41._12_4_ - auVar59._12_4_;
        sVar20 = auVar59._0_2_;
        sVar44 = (short)iVar45;
        auVar46._0_2_ = (ushort)(sVar20 < sVar44) * sVar20 | (ushort)(sVar20 >= sVar44) * sVar44;
        sVar20 = auVar59._2_2_;
        sVar44 = (short)((uint)iVar45 >> 0x10);
        auVar46._2_2_ = (ushort)(sVar20 < sVar44) * sVar20 | (ushort)(sVar20 >= sVar44) * sVar44;
        sVar20 = auVar59._4_2_;
        sVar44 = (short)iVar49;
        auVar46._4_2_ = (ushort)(sVar20 < sVar44) * sVar20 | (ushort)(sVar20 >= sVar44) * sVar44;
        sVar20 = auVar59._6_2_;
        sVar44 = (short)((uint)iVar49 >> 0x10);
        auVar46._6_2_ = (ushort)(sVar20 < sVar44) * sVar20 | (ushort)(sVar20 >= sVar44) * sVar44;
        sVar20 = auVar59._8_2_;
        sVar44 = (short)iVar50;
        auVar46._8_2_ = (ushort)(sVar20 < sVar44) * sVar20 | (ushort)(sVar20 >= sVar44) * sVar44;
        sVar20 = auVar59._10_2_;
        sVar44 = (short)((uint)iVar50 >> 0x10);
        auVar46._10_2_ = (ushort)(sVar20 < sVar44) * sVar20 | (ushort)(sVar20 >= sVar44) * sVar44;
        sVar20 = auVar59._12_2_;
        sVar44 = (short)iVar51;
        sVar52 = (short)((uint)iVar51 >> 0x10);
        auVar46._12_2_ = (ushort)(sVar20 < sVar44) * sVar20 | (ushort)(sVar20 >= sVar44) * sVar44;
        sVar20 = auVar59._14_2_;
        auVar46._14_2_ = (ushort)(sVar20 < sVar52) * sVar20 | (ushort)(sVar20 >= sVar52) * sVar52;
        auVar59 = pshuflw(auVar46,auVar46,0);
        auVar60 = pmovzxbw(ZEXT416(*(uint *)(puVar29 + uVar25 * 4)),
                           ZEXT416(*(uint *)(puVar29 + uVar25 * 4)));
        auVar47 = auVar59 ^ auVar42;
        auVar48._0_2_ = auVar47._0_2_ * auVar60._0_2_ + auVar59._0_2_ * sVar32 + auVar43._0_2_;
        auVar48._2_2_ = auVar47._2_2_ * auVar60._2_2_ + auVar59._2_2_ * sVar34 + auVar43._2_2_;
        auVar48._4_2_ = auVar47._4_2_ * auVar60._4_2_ + auVar59._4_2_ * sVar35 + auVar43._4_2_;
        auVar48._6_2_ = auVar47._6_2_ * auVar60._6_2_ + auVar59._6_2_ * sVar36 + auVar43._6_2_;
        auVar48._8_2_ = auVar47._8_2_ * auVar60._8_2_ + auVar59._8_2_ * sVar37 + auVar43._8_2_;
        auVar48._10_2_ = auVar47._10_2_ * auVar60._10_2_ + auVar59._10_2_ * sVar38 + auVar43._10_2_;
        auVar48._12_2_ = auVar47._12_2_ * auVar60._12_2_ + auVar59._12_2_ * sVar39 + auVar43._12_2_;
        auVar48._14_2_ = auVar47._14_2_ * auVar60._14_2_ + auVar59._14_2_ * sVar40 + auVar43._14_2_;
        auVar59 = pmulhuw(auVar48,auVar22);
        sVar20 = auVar59._0_2_;
        sVar44 = auVar59._2_2_;
        sVar52 = auVar59._4_2_;
        sVar56 = auVar59._6_2_;
        *(uint *)(puVar29 + uVar25 * 4) =
             CONCAT13((0 < sVar56) * (sVar56 < 0x100) * auVar59[6] - (0xff < sVar56),
                      CONCAT12((0 < sVar52) * (sVar52 < 0x100) * auVar59[4] - (0xff < sVar52),
                               CONCAT11((0 < sVar44) * (sVar44 < 0x100) * auVar59[2] -
                                        (0xff < sVar44),
                                        (0 < sVar20) * (sVar20 < 0x100) * auVar59[0] -
                                        (0xff < sVar20))));
      }
    }
    puVar29 = puVar29 + lVar6;
    lVar24 = lVar24 + 8;
  }
  (this->_yBounds).start = 0x7fffffff;
  (this->_yBounds).end = 0;
  return;
}

Assistant:

inline void RasterizerA2::_renderImpl(uint32_t argb32) noexcept {
  size_t y0 = size_t(_yBounds.start);
  size_t y1 = size_t(_yBounds.end);

  intptr_t stride = _dst->stride();
  uint8_t* dstLine = _dst->data() + y0 * stride;

  Compositor compositor(argb32);
  while (y0 <= y1) {
    uint32_t* dstPix = reinterpret_cast<uint32_t*>(dstLine);
    Cell* cell = &_cells[y0 * _cellStride];

    if (!_xBounds[y0].empty()) {
      int x0 = _xBounds[y0].start;
      int x1 = std::min(_xBounds[y0].end + 1, _width);
      _xBounds[y0].reset();

      int cover = 0;
      compositor.template vmask<NonZero>(dstPix, size_t(x0), size_t(x1), cell, cover);
    }

    y0++;
    dstLine += stride;
  }

  _yBounds.reset();
}